

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-utils.h
# Opt level: O1

_Bool plutovg_skip_ws_and_comma(char **begin,char *end)

{
  char *it;
  byte *pbVar1;
  byte *pbVar2;
  bool bVar3;
  
  pbVar1 = (byte *)*begin;
  bVar3 = pbVar1 < end;
  pbVar2 = pbVar1;
  if (bVar3) {
    bVar3 = true;
    do {
      pbVar2 = pbVar1;
      if ((0x20 < (ulong)*pbVar1) || ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
      pbVar1 = pbVar1 + 1;
      bVar3 = pbVar1 < end;
      pbVar2 = (byte *)end;
    } while (pbVar1 != (byte *)end);
  }
  if (bVar3) {
    bVar3 = false;
    if (pbVar2 < end) {
      bVar3 = *pbVar2 == 0x2c;
      pbVar2 = pbVar2 + bVar3;
    }
    if (bVar3) {
      pbVar1 = pbVar2;
      if (pbVar2 < end) {
        do {
          pbVar1 = pbVar2;
          if ((0x20 < (ulong)*pbVar2) || ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) == 0))
          break;
          pbVar2 = pbVar2 + 1;
          pbVar1 = (byte *)end;
        } while (pbVar2 != (byte *)end);
      }
      *begin = (char *)pbVar1;
      return pbVar1 < end;
    }
  }
  return false;
}

Assistant:

static inline bool plutovg_skip_ws_and_delim(const char** begin, const char* end, char delim)
{
    const char* it = *begin;
    if(plutovg_skip_ws(&it, end)) {
        if(!plutovg_skip_delim(&it, end, delim))
            return false;
        plutovg_skip_ws(&it, end);
    } else {
        return false;
    }

    *begin = it;
    return it < end;
}